

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

void __thiscall DBOPL::Chip::Chip(Chip *this)

{
  long lVar1;
  
  lVar1 = 0x30;
  do {
    Channel::Channel((Channel *)((long)this->chan[0].op + lVar1 + -0x30));
    lVar1 = lVar1 + 0xf8;
  } while (lVar1 != 0x11a0);
  this->opl3Active = '\0';
  this->reg104 = '\0';
  this->reg08 = '\0';
  this->reg04 = '\0';
  this->regBD = '\0';
  return;
}

Assistant:

Chip::Chip() {
	reg08 = 0;
	reg04 = 0;
	regBD = 0;
	reg104 = 0;
	opl3Active = 0;
}